

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsPreInt
          (ChElementHexaANCF_3843 *this)

{
  double *pdVar1;
  double *pdVar2;
  double *s;
  double *s_00;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *pCVar47;
  long lVar48;
  MatrixNx3c *pMVar49;
  double dVar50;
  ulong uVar51;
  Matrix3xN *pMVar52;
  ChElementHexaANCF_3843 *this_01;
  double *pdVar53;
  ulong uVar54;
  Matrix<double,_32,_3,_0,_32,_3> *pMVar55;
  ActualDstType actualDst;
  double *pdVar56;
  long lVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  ActualDstType actualDst_1;
  ActualDstType actualDst_2;
  ChMatrix33<double> J_0xi;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_3,_3> D33;
  ChMatrixNM<double,_3,_3> D22;
  ChMatrixNM<double,_3,_3> D11;
  DstEvaluatorType dstEvaluator;
  MatrixNx3c Sxi_D_0xi;
  MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
  MatrixNx3c Sxi_D;
  ChMatrixNM<double,_9,_9> D_block;
  MatrixNxN scale;
  undefined1 *local_4bd0;
  add_assign_op<double,_double> local_4bb9;
  double *local_4bb8;
  double *local_4bb0;
  undefined8 uStack_4ba8;
  double *local_4ba0;
  ChElementHexaANCF_3843 *local_4b98;
  ulong local_4b90;
  ulong local_4b88;
  double *local_4b80;
  double *local_4b78;
  ulong local_4b70;
  Matrix<double,__1,__1,_0,__1,__1> *local_4b68;
  Matrix<double,__1,__1,_0,__1,__1> *local_4b60;
  Matrix3xN *local_4b58;
  long local_4b50;
  Matrix<double,__1,__1,_0,__1,__1> *local_4b48;
  undefined1 local_4b40 [24];
  XprTypeNested local_4b28;
  variable_if_dynamic<long,__1> local_4b20;
  variable_if_dynamic<long,__1> local_4b18;
  Index local_4b10;
  Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_> local_4b08;
  undefined1 local_4b00 [88];
  Scalar *local_4aa8;
  add_assign_op<double,_double> *local_4aa0;
  undefined1 *local_4a98;
  Scalar local_4a90;
  double local_4a88;
  undefined1 *local_4a78;
  Matrix<double,_3,_3,_1,_3,_3> local_4a70;
  Matrix<double,_3,_3,_1,_3,_3> local_4a28;
  Matrix<double,_3,_3,_1,_3,_3> local_49e0;
  DstEvaluatorType local_4998;
  undefined1 local_4980 [64];
  Matrix<double,_32,_3,_0,_32,_3> local_4940;
  undefined1 local_4640 [16];
  scalar_constant_op<double> local_4630;
  variable_if_dynamic<long,__1> local_4628;
  Matrix<double,_32,_3,_0,_32,_3> *local_4620;
  Matrix<double,_3,_3,_1,_3,_3> *local_4618;
  RhsNested local_4610;
  Matrix<double,_32,_3,_0,_32,_3> *local_4608;
  Matrix<double,_3,_3,_1,_3,_3> *local_4600;
  RhsNested local_45f8;
  MatrixNx3c *local_45f0;
  LhsNested local_45e8;
  RhsNested local_45e0;
  RhsNested local_45d8;
  MatrixNx3c local_2640;
  undefined1 local_2308 [648];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_2080;
  undefined8 auStack_2060 [1030];
  
  local_4b60 = &this->m_O1;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_4b60,0x100000,0x400,0x400);
  local_4b48 = &this->m_O2;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_4b48,0x100000,0x400,0x400);
  local_4b68 = &this->m_K3Compact;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_4b68,0x400,0x20,0x20);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_K13Compact,0x400,0x20,0x20);
  local_4640._0_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_rows;
  local_4640._8_8_ =
       (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_cols;
  local_4630.m_other = 0.0;
  if (-1 < (long)(local_4640._8_8_ | local_4640._0_8_)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&this->m_K13Compact,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_4640,(assign_op<double,_double> *)(local_2308 + 0x288));
    local_4640._0_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows;
    local_4640._8_8_ =
         (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols;
    local_4630.m_other = 0.0;
    if (-1 < (long)(local_4640._8_8_ | local_4640._0_8_)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                (local_4b68,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_4640,(assign_op<double,_double> *)(local_2308 + 0x288));
      local_4640._0_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_4640._8_8_ =
           (this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_4630.m_other = 0.0;
      if (-1 < (long)(local_4640._8_8_ | local_4640._0_8_)) {
        Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (local_4b60,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_4640,(assign_op<double,_double> *)(local_2308 + 0x288));
        peVar8 = (this->m_material).
                 super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        this_00 = (this->m_material).
                  super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        local_4b98 = this;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = (peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array[0];
        local_4640._0_8_ = local_2308;
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x28);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x30);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[8] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x60);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xf0);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xc0);
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[5] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x90);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 8);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x38);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[8] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x68);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xf8);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 200);
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[5] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x98);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[0] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x10);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[4] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x40);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[8] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x70);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0x100);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[2] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xd0);
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[5] = *(double *)
                    ((long)(peVar8->m_D).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                           m_data.array + 0xa0);
        local_4640._8_8_ = 0;
        local_4630.m_other = 4.94065645841247e-324;
        local_4628.m_value = 1;
        local_2308._0_8_ =
             (peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
             m_data.array[0];
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3] = local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[1];
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6] = local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[2];
        local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7] = local_4a70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[5];
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3] = local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[1];
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6] = local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[2];
        local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7] = local_4a28.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[5];
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[3] = local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[1];
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[6] = local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[2];
        local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
        array[7] = local_49e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                   .m_data.array[5];
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_> *)local_4640,
                             pdVar56);
        pdVar53 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x20);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 8));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x18);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x10));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0xf0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pdVar53 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x118);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pdVar1 = (double *)
                 ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 0x110);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        local_4ba0 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xf8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4ba0);
        pdVar2 = (double *)
                 ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 0x108);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        local_4bb8 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0x100);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb8);
        local_4b78 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xc0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4b78);
        local_4bb0 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xe8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb0);
        s = (double *)
            ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 0xe0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb0);
        local_4b80 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 200);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4b80);
        s_00 = (double *)
               ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                      m_storage.m_data.array + 0xd8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s_00);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s_00);
        local_4980._0_8_ =
             (long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                   m_storage.m_data.array + 0xd0;
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(Scalar *)local_4980._0_8_);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4ba0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x30));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x58);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pdVar53 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x50);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x38));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x48);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x40));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x90);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pdVar53 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0xb8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pdVar1 = (double *)
                 ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 0xb0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        local_4ba0 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0x98);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4ba0);
        pdVar2 = (double *)
                 ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                        m_storage.m_data.array + 0xa8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        local_4bb8 = (double *)
                     ((long)(peVar8->m_D).
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.
                            m_data.array + 0xa0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4b78);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4b80);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s_00);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,s_00);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(Scalar *)local_4980._0_8_);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4ba0);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar1);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar2);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,local_4bb8);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x60));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x88);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pdVar53 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x80);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,(double *)
                                     ((long)(peVar8->m_D).
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>
                                            .m_storage.m_data.array + 0x68));
        pdVar56 = (double *)
                  ((long)(peVar8->m_D).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                         m_storage.m_data.array + 0x78);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar53);
        pCVar47 = Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                            (pCVar47,pdVar56);
        Eigen::CommaInitializer<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>::operator_
                  (pCVar47,(double *)
                           ((long)(peVar8->m_D).
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.
                                  m_storage.m_data.array + 0x70));
        if ((local_4628.m_value + local_4640._8_8_ != 9) ||
           ((Matrix<double,__1,__1,_0,__1,__1> *)local_4630.m_other !=
            (Matrix<double,__1,__1,_0,__1,__1> *)0x9)) {
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 9, 9, 1>>::finished() [MatrixType = Eigen::Matrix<double, 9, 9, 1>]"
                       );
        }
        lVar57 = *(long *)(DAT_00b6ab20 + 0x48);
        lVar48 = *(long *)(DAT_00b6ab20 + 0x50);
        this_01 = local_4b98;
        if (lVar48 != lVar57) {
          pMVar52 = &local_4b98->m_ebar0;
          local_4b88 = 0;
          do {
            bVar58 = lVar48 != lVar57;
            lVar48 = lVar57;
            if (bVar58) {
              local_4b90 = 0;
              local_4b58 = pMVar52;
              do {
                local_4b70 = 0;
                do {
                  pMVar52 = local_4b58;
                  lVar48 = *(long *)(static_tables_3843 + 0x48);
                  local_4bb0 = *(double **)(lVar48 + local_4b88 * 8);
                  dVar50 = *(double *)(lVar48 + local_4b90 * 8);
                  dVar3 = *(double *)(lVar48 + local_4b70 * 8);
                  Calc_Sxi_D(this_01,&local_2640,*(double *)(lVar57 + local_4b88 * 8),
                             *(double *)(lVar57 + local_4b90 * 8),
                             *(double *)(lVar57 + local_4b70 * 8));
                  local_4b00._64_8_ = 0.0;
                  local_4b00._0_8_ = 0.0;
                  local_4b00._8_8_ = 0.0;
                  local_4b00._16_8_ = 0.0;
                  local_4b00._24_8_ = 0.0;
                  local_4b00._32_8_ = 0.0;
                  local_4b00._40_8_ = 0.0;
                  local_4b00._48_8_ = 0.0;
                  local_4b00._56_8_ = 0.0;
                  local_4640._0_8_ = 0x3ff0000000000000;
                  Eigen::internal::
                  generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
                  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
                            ((Matrix<double,_3,_3,_1,_3,_3> *)local_4b00,pMVar52,&local_2640,
                             (Scalar *)local_4640);
                  local_4640._0_8_ = &local_2640;
                  local_2080.m_dst = (DstEvaluatorType *)&local_2640;
                  local_2080.m_src = (SrcEvaluatorType *)local_4b00;
                  Eigen::internal::
                  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_4640 + 8),
                        (SrcXprType *)&local_2080.m_src,(assign_op<double,_double> *)local_4b40);
                  uVar13 = local_4640._0_8_;
                  lVar48 = 7;
                  pdVar56 = local_4940.
                            super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage
                            .m_data.array + 0x18;
                  local_45f0 = (MatrixNx3c *)local_4640._0_8_;
                  local_45e8 = (LhsNested)(local_4640 + 8);
                  local_45e0 = (RhsNested)0x3;
                  do {
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = *(ulong *)(local_4640 + lVar48 * 8 + -0x30);
                    auVar61 = vbroadcastsd_avx512f(auVar59);
                    auVar4._8_8_ = 0;
                    auVar4._0_8_ = *(ulong *)(local_4640 + lVar48 * 8 + -0x18);
                    auVar62 = vbroadcastsd_avx512f(auVar4);
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = *(ulong *)(local_4640 + lVar48 * 8);
                    auVar63 = vbroadcastsd_avx512f(auVar60);
                    lVar48 = lVar48 + 1;
                    auVar64 = vmulpd_avx512f(auVar61,*(undefined1 (*) [64])uVar13);
                    auVar64 = vfmadd231pd_avx512f(auVar64,auVar62,
                                                  *(undefined1 (*) [64])(uVar13 + 0x100));
                    auVar64 = vfmadd231pd_avx512f(auVar64,auVar63,
                                                  *(undefined1 (*) [64])(uVar13 + 0x200));
                    *(undefined1 (*) [64])
                     ((plain_array<double,_96,_0,_64> *)(pdVar56 + -0x18))->array = auVar64;
                    auVar64 = vmulpd_avx512f(auVar61,*(undefined1 (*) [64])(uVar13 + 0x40));
                    auVar64 = vfmadd231pd_avx512f(auVar64,auVar62,
                                                  *(undefined1 (*) [64])(uVar13 + 0x140));
                    auVar64 = vfmadd231pd_avx512f(auVar64,auVar63,
                                                  *(undefined1 (*) [64])(uVar13 + 0x240));
                    *(undefined1 (*) [64])(pdVar56 + -0x10) = auVar64;
                    auVar64 = vmulpd_avx512f(auVar61,*(undefined1 (*) [64])(uVar13 + 0x80));
                    auVar64 = vfmadd231pd_avx512f(auVar64,auVar62,
                                                  *(undefined1 (*) [64])(uVar13 + 0x180));
                    auVar64 = vfmadd231pd_avx512f(auVar64,auVar63,
                                                  *(undefined1 (*) [64])(uVar13 + 0x280));
                    *(undefined1 (*) [64])(pdVar56 + -8) = auVar64;
                    auVar61 = vmulpd_avx512f(auVar61,*(undefined1 (*) [64])(uVar13 + 0xc0));
                    auVar61 = vfmadd231pd_avx512f(auVar61,auVar62,
                                                  *(undefined1 (*) [64])(uVar13 + 0x1c0));
                    auVar61 = vfmadd231pd_avx512f(auVar61,auVar63,
                                                  *(undefined1 (*) [64])(uVar13 + 0x2c0));
                    *(undefined1 (*) [64])pdVar56 = auVar61;
                    pdVar56 = pdVar56 + 0x20;
                  } while (lVar48 != 10);
                  auVar45._8_8_ = local_4b00._40_8_;
                  auVar45._0_8_ = local_4b00._32_8_;
                  auVar46._8_8_ = local_4b00._64_8_;
                  auVar46._0_8_ = local_4b00._56_8_;
                  local_4618 = &local_49e0;
                  local_4600 = &local_4a28;
                  local_45e0 = &local_4a70;
                  auVar10._8_8_ = local_4b00._48_8_;
                  auVar10._0_8_ = local_4b00._48_8_;
                  auVar59 = vmulpd_avx512vl(auVar45,auVar10);
                  auVar11._8_8_ = local_4b00._24_8_;
                  auVar11._0_8_ = local_4b00._24_8_;
                  auVar60 = vfmsub231pd_avx512vl(auVar59,auVar46,auVar11);
                  auVar5._8_8_ = 0;
                  auVar5._0_8_ = local_4b00._64_8_;
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = (double)local_4b00._56_8_ * (double)local_4b00._40_8_;
                  auVar4 = vfmsub132sd_fma(auVar45,auVar71,auVar5);
                  auVar44._8_8_ = local_4b00._16_8_;
                  auVar44._0_8_ = local_4b00._8_8_;
                  auVar59 = vpermilpd_avx(auVar44,1);
                  auVar70._0_8_ = auVar59._0_8_ * auVar60._0_8_;
                  auVar70._8_8_ = auVar59._8_8_ * auVar60._8_8_;
                  auVar59 = vshufpd_avx(auVar70,auVar70,1);
                  auVar12._8_8_ = 0x8000000000000000;
                  auVar12._0_8_ = 0x8000000000000000;
                  auVar69._8_8_ = 0;
                  auVar69._0_8_ =
                       auVar70._0_8_ + (auVar4._0_8_ * (double)local_4b00._0_8_ - auVar59._0_8_);
                  auVar59 = vxorpd_avx512vl(auVar69,auVar12);
                  local_4bb0 = (double *)(dVar50 * (double)local_4bb0 * dVar3 * auVar59._0_8_);
                  uStack_4ba8 = 0;
                  local_4630.m_other = (double)local_4bb0 * 0.5;
                  local_4620 = &local_4940;
                  local_4610.m_matrix = &local_4940;
                  local_4608 = &local_4940;
                  local_45f8.m_matrix = &local_4940;
                  local_45e8 = &local_4940;
                  local_45d8.m_matrix = &local_4940;
                  Eigen::internal::
                  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,32,1,32,32>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>const>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,0>const>const>,Eigen::internal::add_assign_op<double,double>>
                            (local_4b68,
                             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_0>_>_>
                              *)local_4640,(add_assign_op<double,_double> *)(local_2308 + 0x288));
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_4bb0;
                  local_4980 = vbroadcastsd_avx512f(auVar6);
                  lVar48 = 0;
                  local_4bb8 = (double *)&local_4940;
                  do {
                    local_4b78 = (double *)(lVar48 * 3);
                    pdVar56 = (double *)0x0;
                    local_4b80 = (double *)(local_2308 + lVar48 * 0xd8);
                    local_4b50 = lVar48;
                    do {
                      local_4b18.m_value = (long)pdVar56 * 3;
                      local_4b40._0_8_ = &local_4940;
                      local_4b28 = (XprTypeNested)local_2308;
                      local_4b40._8_8_ = local_4b80 + (long)pdVar56 * 3;
                      local_4b20.m_value = (long)local_4b78;
                      local_4b10 = 9;
                      local_4b08.m_matrix = (non_const_type)local_4b40._0_8_;
                      memset((Matrix<double,_32,_32,_1,_32,_32> *)local_4640,0,0x2000);
                      local_4a90 = 1.0;
                      Eigen::internal::
                      generic_product_impl<Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Block<Eigen::Matrix<double,9,9,1,9,9>,3,3,false>,0>,Eigen::Transpose<Eigen::Matrix<double,32,3,0,32,3>>,Eigen::DenseShape,Eigen::DenseShape,8>
                      ::scaleAndAddTo<Eigen::Matrix<double,32,32,1,32,32>>
                                ((Matrix<double,_32,_32,_1,_32,_32> *)local_4640,
                                 (Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Block<Eigen::Matrix<double,_9,_9,_1,_9,_9>,_3,_3,_false>,_0>
                                  *)local_4b40,&local_4b08,&local_4a90);
                      lVar48 = 0xc0;
                      do {
                        uVar13 = *(undefined8 *)(local_4640 + lVar48 + -0xb8);
                        uVar14 = *(undefined8 *)(local_4640 + lVar48 + -0xb0);
                        uVar15 = *(undefined8 *)(local_4640 + lVar48 + -0xa8);
                        uVar16 = *(undefined8 *)(local_4640 + lVar48 + -0xa0);
                        uVar17 = *(undefined8 *)(local_4640 + lVar48 + -0x98);
                        uVar18 = *(undefined8 *)(local_4640 + lVar48 + -0x90);
                        uVar19 = *(undefined8 *)(local_4640 + lVar48 + -0x88);
                        uVar20 = *(undefined8 *)(local_4640 + lVar48 + -0x80);
                        uVar21 = *(undefined8 *)(local_4640 + lVar48 + -0x78);
                        uVar22 = *(undefined8 *)(local_4640 + lVar48 + -0x70);
                        uVar23 = *(undefined8 *)(local_4640 + lVar48 + -0x68);
                        uVar24 = *(undefined8 *)(local_4640 + lVar48 + -0x60);
                        uVar25 = *(undefined8 *)(local_4640 + lVar48 + -0x58);
                        uVar26 = *(undefined8 *)(local_4640 + lVar48 + -0x50);
                        uVar27 = *(undefined8 *)(local_4640 + lVar48 + -0x48);
                        uVar28 = *(undefined8 *)(local_4640 + lVar48 + -0x40);
                        uVar29 = *(undefined8 *)(local_4640 + lVar48 + -0x38);
                        uVar30 = *(undefined8 *)(local_4640 + lVar48 + -0x30);
                        uVar31 = *(undefined8 *)(local_4640 + lVar48 + -0x28);
                        uVar32 = *(undefined8 *)(local_4640 + lVar48 + -0x20);
                        uVar33 = *(undefined8 *)(local_4640 + lVar48 + -0x18);
                        uVar34 = *(undefined8 *)(local_4640 + lVar48 + -0x10);
                        uVar35 = *(undefined8 *)(local_4640 + lVar48 + -8);
                        uVar36 = *(undefined8 *)(local_4640 + lVar48);
                        uVar37 = *(undefined8 *)(local_4640 + lVar48 + 8);
                        uVar38 = *(undefined8 *)((long)&local_4630.m_other + lVar48);
                        uVar39 = *(undefined8 *)((long)&local_4628.m_value + lVar48);
                        uVar40 = *(undefined8 *)((long)&local_4620 + lVar48);
                        uVar41 = *(undefined8 *)((long)&local_4618 + lVar48);
                        uVar42 = *(undefined8 *)((long)&local_4610.m_matrix + lVar48);
                        uVar43 = *(undefined8 *)((long)&local_4608 + lVar48);
                        *(undefined8 *)(local_2308 + lVar48 + 0x1c8) =
                             *(undefined8 *)(local_4640 + lVar48 + -0xc0);
                        *(undefined8 *)(local_2308 + lVar48 + 0x1d0) = uVar13;
                        *(undefined8 *)(local_2308 + lVar48 + 0x1d8) = uVar14;
                        *(undefined8 *)(local_2308 + lVar48 + 0x1e0) = uVar15;
                        *(undefined8 *)(local_2308 + lVar48 + 0x1e8) = uVar16;
                        *(undefined8 *)(local_2308 + lVar48 + 0x1f0) = uVar17;
                        *(undefined8 *)(local_2308 + lVar48 + 0x1f8) = uVar18;
                        *(undefined8 *)(local_2308 + lVar48 + 0x200) = uVar19;
                        *(undefined8 *)(local_2308 + lVar48 + 0x208) = uVar20;
                        *(undefined8 *)(local_2308 + lVar48 + 0x210) = uVar21;
                        *(undefined8 *)(local_2308 + lVar48 + 0x218) = uVar22;
                        *(undefined8 *)(local_2308 + lVar48 + 0x220) = uVar23;
                        *(undefined8 *)(local_2308 + lVar48 + 0x228) = uVar24;
                        *(undefined8 *)(local_2308 + lVar48 + 0x230) = uVar25;
                        *(undefined8 *)(local_2308 + lVar48 + 0x238) = uVar26;
                        *(undefined8 *)(local_2308 + lVar48 + 0x240) = uVar27;
                        *(undefined8 *)(local_2308 + lVar48 + 0x248) = uVar28;
                        *(undefined8 *)(local_2308 + lVar48 + 0x250) = uVar29;
                        *(undefined8 *)(local_2308 + lVar48 + 600) = uVar30;
                        *(undefined8 *)(local_2308 + lVar48 + 0x260) = uVar31;
                        *(undefined8 *)(local_2308 + lVar48 + 0x268) = uVar32;
                        *(undefined8 *)(local_2308 + lVar48 + 0x270) = uVar33;
                        *(undefined8 *)(local_2308 + lVar48 + 0x278) = uVar34;
                        *(undefined8 *)(local_2308 + lVar48 + 0x280) = uVar35;
                        *(undefined8 *)(local_2308 + lVar48 + 0x288) = uVar36;
                        *(undefined8 *)((long)auStack_2060 + lVar48 + -0x18) = uVar37;
                        *(undefined8 *)((long)auStack_2060 + lVar48 + -0x10) = uVar38;
                        *(undefined8 *)((long)auStack_2060 + lVar48 + -8) = uVar39;
                        *(undefined8 *)((long)auStack_2060 + lVar48) = uVar40;
                        *(undefined8 *)((long)auStack_2060 + lVar48 + 8) = uVar41;
                        *(undefined8 *)((long)auStack_2060 + lVar48 + 0x10) = uVar42;
                        *(undefined8 *)((long)auStack_2060 + lVar48 + 0x18) = uVar43;
                        lVar48 = lVar48 + 0x100;
                      } while (lVar48 != 0x20c0);
                      lVar48 = 0xc0;
                      do {
                        auVar61 = vmulpd_avx512f(local_4980,
                                                 *(undefined1 (*) [64])(local_2308 + lVar48 + 0x1c8)
                                                );
                        *(undefined1 (*) [64])(local_2308 + lVar48 + 0x1c8) = auVar61;
                        auVar61 = vmulpd_avx512f(local_4980,
                                                 *(undefined1 (*) [64])(local_2308 + lVar48 + 0x208)
                                                );
                        *(undefined1 (*) [64])(local_2308 + lVar48 + 0x208) = auVar61;
                        auVar61 = vmulpd_avx512f(local_4980,
                                                 *(undefined1 (*) [64])(local_2308 + lVar48 + 0x248)
                                                );
                        *(undefined1 (*) [64])(local_2308 + lVar48 + 0x248) = auVar61;
                        auVar61 = vmulpd_avx512f(local_4980,
                                                 *(undefined1 (*) [64])(local_2308 + lVar48 + 0x288)
                                                );
                        *(undefined1 (*) [64])(local_2308 + lVar48 + 0x288) = auVar61;
                        lVar48 = lVar48 + 0x100;
                      } while (lVar48 != 0x20c0);
                      auVar61 = *(undefined1 (*) [64])
                                 (local_4940.
                                  super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                                  m_storage.m_data.array + (long)pdVar56 * 0x20);
                      auVar62 = *(undefined1 (*) [64])
                                 (local_4940.
                                  super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                                  m_storage.m_data.array + (long)pdVar56 * 0x20U + 8);
                      auVar63 = *(undefined1 (*) [64])
                                 (local_4940.
                                  super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.
                                  m_storage.m_data.array + (long)pdVar56 * 0x20U + 0x10);
                      auVar64 = *(undefined1 (*) [64])(local_4640 + (long)pdVar56 * 0x100 + -0x240);
                      lVar48 = 0x18;
                      pdVar53 = local_4bb8;
                      do {
                        auVar7._8_8_ = 0;
                        auVar7._0_8_ = *pdVar53;
                        auVar65 = vbroadcastsd_avx512f(auVar7);
                        pdVar53 = pdVar53 + 1;
                        auVar66 = vmulpd_avx512f(auVar61,auVar65);
                        auVar67 = vmulpd_avx512f(auVar65,auVar62);
                        auVar68 = vmulpd_avx512f(auVar65,auVar63);
                        auVar65 = vmulpd_avx512f(auVar65,auVar64);
                        *(undefined1 (*) [64])(local_4640 + lVar48 * 8 + -0xc0) = auVar66;
                        *(undefined1 (*) [64])(local_4640 + lVar48 * 8 + -0x80) = auVar67;
                        *(undefined1 (*) [64])(local_4640 + lVar48 * 8 + -0x40) = auVar68;
                        *(undefined1 (*) [64])(local_4640 + lVar48 * 8) = auVar65;
                        lVar48 = lVar48 + 0x20;
                      } while (lVar48 != 0x418);
                      local_4bd0 = local_2308 + 0x288;
                      uVar51 = 0;
                      local_4bb0 = (double *)0x0;
                      local_4ba0 = pdVar56;
                      do {
                        pdVar53 = (double *)(uVar51 * 0x20);
                        lVar48 = 0;
                        uVar54 = 0;
                        pdVar56 = (double *)0x0;
                        do {
                          if (0x1f < (uVar54 | uVar51)) {
                            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",
                                          0x16f,
                                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 32, 32, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 32, 32, 1>, Level = 1]"
                                         );
                          }
                          local_4b18.m_value =
                               (local_4b98->m_O1).
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows;
                          local_4b40._0_8_ =
                               (long)(local_4b98->m_O1).
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     .m_storage.m_data +
                               lVar48 + (long)local_4bb0 * local_4b18.m_value;
                          local_4b40._16_8_ = local_4b60;
                          local_4b28 = (XprTypeNested)pdVar56;
                          local_4b20.m_value = (long)pdVar53;
                          if ((local_4b18.m_value < (long)(pdVar56 + 4)) ||
                             ((local_4b98->m_O1).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols < (long)(pdVar53 + 4))) goto LAB_006ff73d;
                          local_4a78 = local_4640;
                          local_4aa8 = &local_4a90;
                          local_4b00._80_8_ = &local_4998;
                          local_4aa0 = &local_4bb9;
                          local_4a98 = local_4b40;
                          local_4a88 = *(double *)(local_4bd0 + lVar48);
                          local_4998.
                          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false,_true>
                          .
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>,_Eigen::Matrix<double,_32,_32,_0,_32,_32>_>
                          .m_data = (PointerType)local_4b40._0_8_;
                          local_4998.
                          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false,_true>
                          .
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>,_Eigen::Matrix<double,_32,_32,_0,_32,_32>_>
                          .m_outerStride.m_value = local_4b18.m_value;
                          Eigen::internal::
                          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_0,_1>
                          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_const_Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
                                 *)(local_4b00 + 0x50));
                          uVar54 = uVar54 + 1;
                          lVar48 = lVar48 + 0x100;
                          pdVar56 = pdVar56 + 4;
                        } while (uVar54 != 0x20);
                        local_4bd0 = local_4bd0 + 8;
                        local_4bb0 = (double *)((long)local_4bb0 + 0x100);
                        uVar51 = uVar51 + 1;
                      } while (uVar51 != 0x20);
                      pdVar56 = (double *)((long)local_4ba0 + 1);
                    } while (pdVar56 != (double *)0x3);
                    local_4bb8 = local_4bb8 + 0x20;
                    lVar48 = local_4b50 + 1;
                  } while (lVar48 != 3);
                  local_4b70 = (ulong)((int)local_4b70 + 1);
                  lVar57 = *(long *)(DAT_00b6ab20 + 0x48);
                  uVar51 = *(long *)(DAT_00b6ab20 + 0x50) - lVar57 >> 3;
                  this_01 = local_4b98;
                } while (local_4b70 < uVar51);
                local_4b90 = (ulong)((int)local_4b90 + 1);
              } while ((local_4b90 < uVar51) && (*(long *)(DAT_00b6ab20 + 0x50) != lVar57));
              lVar57 = *(long *)(DAT_00b6ab20 + 0x48);
              lVar48 = *(long *)(DAT_00b6ab20 + 0x50);
              pMVar52 = local_4b58;
            }
            local_4b88 = (ulong)((int)local_4b88 + 1);
          } while (local_4b88 < (ulong)(lVar48 - lVar57 >> 3));
        }
        lVar48 = 0;
        local_4bb0 = (double *)0x0;
        do {
          pMVar55 = (Matrix<double,_32,_3,_0,_32,_3> *)((long)local_4bb0 * 0x20);
          lVar57 = 0;
          pdVar56 = (pMVar55->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                    m_storage.m_data.array + 4;
          dVar50 = 0.0;
          do {
            dVar9 = (double)(this_01->m_O1).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows;
            dVar3 = (double)((long)dVar50 + 0x20);
            if (((long)dVar9 < (long)dVar3) ||
               ((this_01->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols < (long)pdVar56)) {
LAB_006ff73d:
              __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 32, BlockCols = 32, InnerPanel = false]"
                           );
            }
            local_4618 = (Matrix<double,_3,_3,_1,_3,_3> *)
                         (this_01->m_O2).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows;
            pdVar53 = (this_01->m_O2).
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data;
            local_4640._0_8_ = (long)pdVar53 + lVar57 + lVar48 * (long)local_4618;
            local_4630.m_other = (double)local_4b48;
            local_4628.m_value = (long)dVar50;
            local_4620 = pMVar55;
            if (((long)local_4618 < (long)dVar3) ||
               ((this_01->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols < (long)pdVar56)) goto LAB_006ff73d;
            pMVar49 = (MatrixNx3c *)
                      ((long)(this_01->m_O1).
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data + lVar57 + lVar48 * (long)dVar9);
            if ((pdVar53 != (double *)0x0) && ((MatrixNx3c *)local_4640._0_8_ == pMVar49)) {
              __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                            ,"/usr/include/eigen3/Eigen/src/Core/Transpose.h",0x1b6,
                            "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>, Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>, OtherDerived = Eigen::Transpose<Eigen::Block<Eigen::Matrix<double, -1, -1>, 32, 32>>, MightHaveTransposeAliasing = true]"
                           );
            }
            local_2080.m_dst = (DstEvaluatorType *)&local_4940;
            local_2080.m_src = (SrcEvaluatorType *)&local_2640;
            local_2080.m_functor = (assign_op<double,_double> *)local_4b00;
            local_2080.m_dstExpr = (DstXprType *)local_4640;
            local_4940.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[0] = (double)local_4640._0_8_;
            local_4940.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[2] = (double)local_4618;
            local_2640.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[0] = (double)pMVar49;
            local_2640.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>.m_storage.
            m_data.array[2] = dVar9;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_32,_32,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_32,_32,_false>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)(local_2308 + 0x288));
            lVar57 = lVar57 + 0x100;
            dVar50 = dVar3;
            this_01 = local_4b98;
          } while (dVar3 != 5.05923221341436e-321);
          lVar48 = lVar48 + 0x100;
          local_4bb0 = (double *)((long)local_4bb0 + 1);
          if (local_4bb0 == (double *)0x20) {
            return;
          }
        } while( true );
      }
    }
  }
  local_4630.m_other = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, PlainObjectType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

void ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsPreInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = NP - 1;  // Gauss-Quadrature table index for xi, eta, and zeta

    m_O1.resize(NSF * NSF, NSF * NSF);
    m_O2.resize(NSF * NSF, NSF * NSF);
    m_K3Compact.resize(NSF, NSF);
    m_K13Compact.resize(NSF, NSF);

    m_K13Compact.setZero();
    m_K3Compact.setZero();
    m_O1.setZero();

    // =============================================================================
    // Get the stiffness tensor in 6x6 matrix form
    // =============================================================================

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    // =============================================================================
    // Pull the required entries from the 4th order stiffness tensor that are needed for K3.  Note that D is written
    // in Voigt notation rather than a 4th other tensor so the correct entries from that matrix need to be pulled.
    // D11 = slice (matrix) of the 4th order tensor with last two subscripts = 1)
    // D22 = slice (matrix) of the 4th order tensor with last two subscripts = 2)
    // D33 = slice (matrix) of the 4th order tensor with last two subscripts = 3)
    // =============================================================================
    ChMatrixNM<double, 3, 3> D11;
    ChMatrixNM<double, 3, 3> D22;
    ChMatrixNM<double, 3, 3> D33;
    D11(0, 0) = D(0, 0);
    D11(1, 1) = D(1, 0);
    D11(2, 2) = D(2, 0);
    D11(1, 0) = D(5, 0);
    D11(0, 1) = D(5, 0);
    D11(2, 0) = D(4, 0);
    D11(0, 2) = D(4, 0);
    D11(2, 1) = D(3, 0);
    D11(1, 2) = D(3, 0);

    D22(0, 0) = D(0, 1);
    D22(1, 1) = D(1, 1);
    D22(2, 2) = D(2, 1);
    D22(1, 0) = D(5, 1);
    D22(0, 1) = D(5, 1);
    D22(2, 0) = D(4, 1);
    D22(0, 2) = D(4, 1);
    D22(2, 1) = D(3, 1);
    D22(1, 2) = D(3, 1);

    D33(0, 0) = D(0, 2);
    D33(1, 1) = D(1, 2);
    D33(2, 2) = D(2, 2);
    D33(1, 0) = D(5, 2);
    D33(0, 1) = D(5, 2);
    D33(2, 0) = D(4, 2);
    D33(0, 2) = D(4, 2);
    D33(2, 1) = D(3, 2);
    D33(1, 2) = D(3, 2);

    // Setup the stiffness tensor in block matrix form to make it easier to iterate through all 4 subscripts
    ChMatrixNM<double, 9, 9> D_block;
    D_block << D(0, 0), D(0, 5), D(0, 4), D(0, 5), D(0, 1), D(0, 3), D(0, 4), D(0, 3), D(0, 2), D(5, 0), D(5, 5),
        D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3), D(5, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(5, 0), D(5, 5), D(5, 4), D(5, 5), D(5, 1), D(5, 3), D(5, 4), D(5, 3),
        D(5, 2), D(1, 0), D(1, 5), D(1, 4), D(1, 5), D(1, 1), D(1, 3), D(1, 4), D(1, 3), D(1, 2), D(3, 0), D(3, 5),
        D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3), D(3, 2), D(4, 0), D(4, 5), D(4, 4), D(4, 5), D(4, 1),
        D(4, 3), D(4, 4), D(4, 3), D(4, 2), D(3, 0), D(3, 5), D(3, 4), D(3, 5), D(3, 1), D(3, 3), D(3, 4), D(3, 3),
        D(3, 2), D(2, 0), D(2, 5), D(2, 4), D(2, 5), D(2, 1), D(2, 3), D(2, 4), D(2, 3), D(2, 2);

    // Loop over each Gauss quadrature point and sum the contribution to each constant matrix that will be used for
    // the internal force calculations
    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];

                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                MatrixNx3c Sxi_D_0xi = Sxi_D * J_0xi.inverse();
                double GQWeight_det_J_0xi = -J_0xi.determinant() * GQ_weight;

                m_K3Compact += GQWeight_det_J_0xi * 0.5 *
                               (Sxi_D_0xi * D11 * Sxi_D_0xi.transpose() + Sxi_D_0xi * D22 * Sxi_D_0xi.transpose() +
                                Sxi_D_0xi * D33 * Sxi_D_0xi.transpose());

                MatrixNxN scale;
                for (unsigned int n = 0; n < 3; n++) {
                    for (unsigned int c = 0; c < 3; c++) {
                        scale = Sxi_D_0xi * D_block.block<3, 3>(3 * n, 3 * c) * Sxi_D_0xi.transpose();
                        scale *= GQWeight_det_J_0xi;

                        MatrixNxN Sxi_D_0xi_n_Sxi_D_0xi_c_transpose =
                            Sxi_D_0xi.template block<NSF, 1>(0, n) * Sxi_D_0xi.template block<NSF, 1>(0, c).transpose();
                        for (unsigned int f = 0; f < NSF; f++) {
                            for (unsigned int t = 0; t < NSF; t++) {
                                m_O1.block<NSF, NSF>(NSF * t, NSF * f) +=
                                    scale(t, f) * Sxi_D_0xi_n_Sxi_D_0xi_c_transpose;
                            }
                        }
                    }
                }
            }
        }
    }

    // Since O2 is just a reordered version of O1, wait until O1 is completely calculated and then generate O2 from it
    for (unsigned int f = 0; f < NSF; f++) {
        for (unsigned int t = 0; t < NSF; t++) {
            m_O2.block<NSF, NSF>(NSF * t, NSF * f) = m_O1.block<NSF, NSF>(NSF * t, NSF * f).transpose();
        }
    }
}